

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O3

void fdct16_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  int iVar50;
  int iVar51;
  undefined7 in_register_00000011;
  int iVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  undefined1 auVar56 [16];
  uint local_460;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  
  iVar51 = 1 << (bit - 1U & 0x1f);
  if (0 < col_num) {
    local_460 = (uint)CONCAT71(in_register_00000011,bit);
    lVar54 = (long)(int)local_460 * 0x100;
    iVar16 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1a0);
    iVar17 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1e0);
    iVar52 = -iVar17;
    iVar18 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x220);
    iVar53 = -iVar18;
    iVar50 = -iVar16;
    uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x240);
    uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x180);
    uVar4 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x1c0);
    uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x200);
    uVar6 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x250);
    uVar7 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x170);
    uVar8 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x1d0);
    uVar9 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x1f0);
    uVar10 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x210);
    lVar55 = 0;
    uVar11 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x1b0);
    uVar12 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 400);
    uVar13 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x230);
    do {
      auVar14 = *(undefined1 (*) [32])((long)*in + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 0xf)] + lVar55);
      auVar19 = vpaddd_avx2(auVar15,auVar14);
      auVar27 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = *(undefined1 (*) [32])((long)in[(uint)col_num] + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 0xe)] + lVar55);
      auVar20 = vpaddd_avx2(auVar15,auVar14);
      auVar28 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 2)] + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 0xd)] + lVar55);
      auVar21 = vpaddd_avx2(auVar15,auVar14);
      auVar29 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 3)] + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 0xc)] + lVar55);
      auVar22 = vpaddd_avx2(auVar15,auVar14);
      auVar30 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 4)] + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 0xb)] + lVar55);
      auVar23 = vpaddd_avx2(auVar15,auVar14);
      auVar31 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 5)] + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 10)] + lVar55);
      auVar24 = vpaddd_avx2(auVar15,auVar14);
      auVar32 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 6)] + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 9)] + lVar55);
      auVar25 = vpaddd_avx2(auVar15,auVar14);
      auVar33 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 7)] + lVar55);
      auVar15 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 8)] + lVar55);
      auVar26 = vpaddd_avx2(auVar15,auVar14);
      auVar34 = vpsubd_avx2(auVar14,auVar15);
      auVar14 = vpaddd_avx2(auVar26,auVar19);
      auVar35 = vpsubd_avx2(auVar19,auVar26);
      auVar15 = vpaddd_avx2(auVar25,auVar20);
      auVar26 = vpsubd_avx2(auVar20,auVar25);
      auVar19 = vpaddd_avx2(auVar24,auVar21);
      auVar36 = vpsubd_avx2(auVar21,auVar24);
      auVar20 = vpaddd_avx2(auVar23,auVar22);
      auVar37 = vpsubd_avx2(auVar22,auVar23);
      auVar49._4_4_ = iVar17;
      auVar49._0_4_ = iVar17;
      auVar49._8_4_ = iVar17;
      auVar49._12_4_ = iVar17;
      auVar49._16_4_ = iVar17;
      auVar49._20_4_ = iVar17;
      auVar49._24_4_ = iVar17;
      auVar49._28_4_ = iVar17;
      auVar21 = vpmulld_avx2(auVar29,auVar49);
      auVar38._4_4_ = iVar51;
      auVar38._0_4_ = iVar51;
      auVar38._8_4_ = iVar51;
      auVar38._12_4_ = iVar51;
      auVar38._16_4_ = iVar51;
      auVar38._20_4_ = iVar51;
      auVar38._24_4_ = iVar51;
      auVar38._28_4_ = iVar51;
      auVar21 = vpaddd_avx2(auVar21,auVar38);
      auVar48._4_4_ = iVar52;
      auVar48._0_4_ = iVar52;
      auVar48._8_4_ = iVar52;
      auVar48._12_4_ = iVar52;
      auVar48._16_4_ = iVar52;
      auVar48._20_4_ = iVar52;
      auVar48._24_4_ = iVar52;
      auVar48._28_4_ = iVar52;
      auVar22 = vpmulld_avx2(auVar32,auVar48);
      auVar21 = vpaddd_avx2(auVar21,auVar22);
      auVar22 = vpmulld_avx2(auVar32,auVar49);
      auVar23 = vpmulld_avx2(auVar48,auVar29);
      auVar23 = vpsubd_avx2(auVar38,auVar23);
      auVar22 = vpaddd_avx2(auVar22,auVar23);
      auVar23 = vpmulld_avx2(auVar30,auVar49);
      auVar23 = vpaddd_avx2(auVar38,auVar23);
      auVar24 = vpmulld_avx2(auVar31,auVar48);
      auVar23 = vpaddd_avx2(auVar24,auVar23);
      auVar24 = vpmulld_avx2(auVar31,auVar49);
      auVar25 = vpmulld_avx2(auVar48,auVar30);
      auVar25 = vpsubd_avx2(auVar38,auVar25);
      auVar24 = vpaddd_avx2(auVar25,auVar24);
      auVar25 = vpaddd_avx2(auVar14,auVar20);
      auVar29 = vpsubd_avx2(auVar14,auVar20);
      auVar14 = vpaddd_avx2(auVar15,auVar19);
      auVar30 = vpsubd_avx2(auVar15,auVar19);
      auVar15 = vpmulld_avx2(auVar36,auVar48);
      auVar15 = vpaddd_avx2(auVar38,auVar15);
      auVar19 = vpmulld_avx2(auVar26,auVar49);
      auVar15 = vpaddd_avx2(auVar15,auVar19);
      auVar19 = vpmulld_avx2(auVar36,auVar49);
      auVar20 = vpmulld_avx2(auVar48,auVar26);
      auVar19 = vpaddd_avx2(auVar38,auVar19);
      auVar31 = vpsubd_avx2(auVar19,auVar20);
      auVar20 = vpsrad_avx2(auVar23,ZEXT416(local_460));
      auVar19 = vpaddd_avx2(auVar34,auVar20);
      auVar32 = vpsubd_avx2(auVar34,auVar20);
      auVar21 = vpsrad_avx2(auVar21,ZEXT416(local_460));
      auVar20 = vpaddd_avx2(auVar33,auVar21);
      auVar33 = vpsubd_avx2(auVar33,auVar21);
      auVar56 = ZEXT416(local_460);
      auVar21 = vpsrad_avx2(auVar24,auVar56);
      auVar34 = vpsubd_avx2(auVar27,auVar21);
      auVar21 = vpaddd_avx2(auVar27,auVar21);
      auVar22 = vpsrad_avx2(auVar22,auVar56);
      auVar36 = vpsubd_avx2(auVar28,auVar22);
      auVar22 = vpaddd_avx2(auVar28,auVar22);
      auVar23 = vpmulld_avx2(auVar25,auVar49);
      auVar24 = vpmulld_avx2(auVar14,auVar49);
      auVar14 = vpaddd_avx2(auVar38,auVar24);
      auVar14 = vpaddd_avx2(auVar14,auVar23);
      auVar24 = vpsubd_avx2(auVar38,auVar24);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar47._4_4_ = iVar18;
      auVar47._0_4_ = iVar18;
      auVar47._8_4_ = iVar18;
      auVar47._12_4_ = iVar18;
      auVar47._16_4_ = iVar18;
      auVar47._20_4_ = iVar18;
      auVar47._24_4_ = iVar18;
      auVar47._28_4_ = iVar18;
      auVar24 = vpmulld_avx2(auVar30,auVar47);
      auVar24 = vpaddd_avx2(auVar38,auVar24);
      auVar26._4_4_ = iVar16;
      auVar26._0_4_ = iVar16;
      auVar26._8_4_ = iVar16;
      auVar26._12_4_ = iVar16;
      auVar26._16_4_ = iVar16;
      auVar26._20_4_ = iVar16;
      auVar26._24_4_ = iVar16;
      auVar26._28_4_ = iVar16;
      auVar25 = vpmulld_avx2(auVar29,auVar26);
      auVar24 = vpaddd_avx2(auVar25,auVar24);
      auVar25 = vpmulld_avx2(auVar29,auVar47);
      auVar26 = vpmulld_avx2(auVar26,auVar30);
      auVar26 = vpsubd_avx2(auVar38,auVar26);
      auVar25 = vpaddd_avx2(auVar26,auVar25);
      auVar26 = vpsrad_avx2(auVar15,auVar56);
      auVar15 = vpaddd_avx2(auVar26,auVar37);
      auVar29 = vpsubd_avx2(auVar37,auVar26);
      auVar26 = vpsrad_avx2(auVar31,auVar56);
      auVar30 = vpsubd_avx2(auVar35,auVar26);
      auVar26 = vpaddd_avx2(auVar26,auVar35);
      auVar37._4_4_ = iVar50;
      auVar37._0_4_ = iVar50;
      auVar37._8_4_ = iVar50;
      auVar37._12_4_ = iVar50;
      auVar37._16_4_ = iVar50;
      auVar37._20_4_ = iVar50;
      auVar37._24_4_ = iVar50;
      auVar37._28_4_ = iVar50;
      auVar27 = vpmulld_avx2(auVar20,auVar37);
      auVar27 = vpaddd_avx2(auVar38,auVar27);
      auVar28 = vpmulld_avx2(auVar22,auVar47);
      auVar27 = vpaddd_avx2(auVar28,auVar27);
      auVar20 = vpmulld_avx2(auVar20,auVar47);
      auVar22 = vpmulld_avx2(auVar37,auVar22);
      auVar20 = vpaddd_avx2(auVar38,auVar20);
      auVar31 = vpsubd_avx2(auVar20,auVar22);
      auVar28._4_4_ = iVar53;
      auVar28._0_4_ = iVar53;
      auVar28._8_4_ = iVar53;
      auVar28._12_4_ = iVar53;
      auVar28._16_4_ = iVar53;
      auVar28._20_4_ = iVar53;
      auVar28._24_4_ = iVar53;
      auVar28._28_4_ = iVar53;
      auVar20 = vpmulld_avx2(auVar33,auVar28);
      auVar20 = vpaddd_avx2(auVar38,auVar20);
      auVar22 = vpmulld_avx2(auVar36,auVar37);
      auVar20 = vpaddd_avx2(auVar22,auVar20);
      auVar22 = vpmulld_avx2(auVar33,auVar37);
      auVar28 = vpmulld_avx2(auVar28,auVar36);
      auVar22 = vpaddd_avx2(auVar38,auVar22);
      auVar33 = vpsubd_avx2(auVar22,auVar28);
      auVar46._4_4_ = uVar2;
      auVar46._0_4_ = uVar2;
      auVar46._8_4_ = uVar2;
      auVar46._12_4_ = uVar2;
      auVar46._16_4_ = uVar2;
      auVar46._20_4_ = uVar2;
      auVar46._24_4_ = uVar2;
      auVar46._28_4_ = uVar2;
      auVar22 = vpmulld_avx2(auVar15,auVar46);
      auVar22 = vpaddd_avx2(auVar38,auVar22);
      auVar45._4_4_ = uVar3;
      auVar45._0_4_ = uVar3;
      auVar45._8_4_ = uVar3;
      auVar45._12_4_ = uVar3;
      auVar45._16_4_ = uVar3;
      auVar45._20_4_ = uVar3;
      auVar45._24_4_ = uVar3;
      auVar45._28_4_ = uVar3;
      auVar28 = vpmulld_avx2(auVar26,auVar45);
      auVar22 = vpaddd_avx2(auVar22,auVar28);
      auVar26 = vpmulld_avx2(auVar26,auVar46);
      auVar15 = vpmulld_avx2(auVar45,auVar15);
      auVar15 = vpsubd_avx2(auVar38,auVar15);
      auVar15 = vpaddd_avx2(auVar15,auVar26);
      auVar44._4_4_ = uVar4;
      auVar44._0_4_ = uVar4;
      auVar44._8_4_ = uVar4;
      auVar44._12_4_ = uVar4;
      auVar44._16_4_ = uVar4;
      auVar44._20_4_ = uVar4;
      auVar44._24_4_ = uVar4;
      auVar44._28_4_ = uVar4;
      auVar26 = vpmulld_avx2(auVar29,auVar44);
      auVar26 = vpaddd_avx2(auVar38,auVar26);
      auVar43._4_4_ = uVar5;
      auVar43._0_4_ = uVar5;
      auVar43._8_4_ = uVar5;
      auVar43._12_4_ = uVar5;
      auVar43._16_4_ = uVar5;
      auVar43._20_4_ = uVar5;
      auVar43._24_4_ = uVar5;
      auVar43._28_4_ = uVar5;
      auVar28 = vpmulld_avx2(auVar30,auVar43);
      auVar26 = vpaddd_avx2(auVar26,auVar28);
      auVar28 = vpmulld_avx2(auVar30,auVar44);
      auVar29 = vpmulld_avx2(auVar43,auVar29);
      auVar29 = vpsubd_avx2(auVar38,auVar29);
      auVar28 = vpaddd_avx2(auVar29,auVar28);
      auVar56 = ZEXT416(local_460);
      auVar29 = vpsrad_avx2(auVar27,auVar56);
      auVar27 = vpaddd_avx2(auVar29,auVar19);
      auVar35 = vpsubd_avx2(auVar19,auVar29);
      auVar19 = vpsrad_avx2(auVar20,auVar56);
      auVar36 = vpsubd_avx2(auVar32,auVar19);
      auVar19 = vpaddd_avx2(auVar19,auVar32);
      auVar29 = vpsrad_avx2(auVar33,auVar56);
      auVar20 = vpaddd_avx2(auVar29,auVar34);
      auVar33 = vpsubd_avx2(auVar34,auVar29);
      auVar29 = vpsrad_avx2(auVar31,auVar56);
      auVar31 = vpsubd_avx2(auVar21,auVar29);
      auVar21 = vpaddd_avx2(auVar29,auVar21);
      auVar42._4_4_ = uVar6;
      auVar42._0_4_ = uVar6;
      auVar42._8_4_ = uVar6;
      auVar42._12_4_ = uVar6;
      auVar42._16_4_ = uVar6;
      auVar42._20_4_ = uVar6;
      auVar42._24_4_ = uVar6;
      auVar42._28_4_ = uVar6;
      auVar29 = vpmulld_avx2(auVar27,auVar42);
      auVar29 = vpaddd_avx2(auVar38,auVar29);
      auVar41._4_4_ = uVar7;
      auVar41._0_4_ = uVar7;
      auVar41._8_4_ = uVar7;
      auVar41._12_4_ = uVar7;
      auVar41._16_4_ = uVar7;
      auVar41._20_4_ = uVar7;
      auVar41._24_4_ = uVar7;
      auVar41._28_4_ = uVar7;
      auVar30 = vpmulld_avx2(auVar21,auVar41);
      auVar29 = vpaddd_avx2(auVar30,auVar29);
      auVar21 = vpmulld_avx2(auVar21,auVar42);
      auVar27 = vpmulld_avx2(auVar41,auVar27);
      auVar27 = vpsubd_avx2(auVar38,auVar27);
      auVar21 = vpaddd_avx2(auVar27,auVar21);
      auVar40._4_4_ = uVar8;
      auVar40._0_4_ = uVar8;
      auVar40._8_4_ = uVar8;
      auVar40._12_4_ = uVar8;
      auVar40._16_4_ = uVar8;
      auVar40._20_4_ = uVar8;
      auVar40._24_4_ = uVar8;
      auVar40._28_4_ = uVar8;
      auVar27 = vpmulld_avx2(auVar35,auVar40);
      auVar27 = vpaddd_avx2(auVar38,auVar27);
      auVar32._4_4_ = uVar9;
      auVar32._0_4_ = uVar9;
      auVar32._8_4_ = uVar9;
      auVar32._12_4_ = uVar9;
      auVar32._16_4_ = uVar9;
      auVar32._20_4_ = uVar9;
      auVar32._24_4_ = uVar9;
      auVar32._28_4_ = uVar9;
      auVar30 = vpmulld_avx2(auVar31,auVar32);
      auVar27 = vpaddd_avx2(auVar30,auVar27);
      auVar30 = vpmulld_avx2(auVar31,auVar40);
      auVar31 = vpmulld_avx2(auVar32,auVar35);
      auVar31 = vpsubd_avx2(auVar38,auVar31);
      auVar30 = vpaddd_avx2(auVar31,auVar30);
      auVar39._4_4_ = uVar10;
      auVar39._0_4_ = uVar10;
      auVar39._8_4_ = uVar10;
      auVar39._12_4_ = uVar10;
      auVar39._16_4_ = uVar10;
      auVar39._20_4_ = uVar10;
      auVar39._24_4_ = uVar10;
      auVar39._28_4_ = uVar10;
      auVar31 = vpmulld_avx2(auVar36,auVar39);
      auVar31 = vpaddd_avx2(auVar31,auVar38);
      auVar34._4_4_ = uVar11;
      auVar34._0_4_ = uVar11;
      auVar34._8_4_ = uVar11;
      auVar34._12_4_ = uVar11;
      auVar34._16_4_ = uVar11;
      auVar34._20_4_ = uVar11;
      auVar34._24_4_ = uVar11;
      auVar34._28_4_ = uVar11;
      auVar32 = vpmulld_avx2(auVar33,auVar34);
      auVar31 = vpaddd_avx2(auVar31,auVar32);
      auVar32 = vpmulld_avx2(auVar33,auVar39);
      auVar33 = vpmulld_avx2(auVar34,auVar36);
      auVar33 = vpsubd_avx2(auVar38,auVar33);
      auVar32 = vpaddd_avx2(auVar33,auVar32);
      auVar36._4_4_ = uVar12;
      auVar36._0_4_ = uVar12;
      auVar36._8_4_ = uVar12;
      auVar36._12_4_ = uVar12;
      auVar36._16_4_ = uVar12;
      auVar36._20_4_ = uVar12;
      auVar36._24_4_ = uVar12;
      auVar36._28_4_ = uVar12;
      auVar33 = vpmulld_avx2(auVar19,auVar36);
      auVar33 = vpaddd_avx2(auVar33,auVar38);
      auVar35._4_4_ = uVar13;
      auVar35._0_4_ = uVar13;
      auVar35._8_4_ = uVar13;
      auVar35._12_4_ = uVar13;
      auVar35._16_4_ = uVar13;
      auVar35._20_4_ = uVar13;
      auVar35._24_4_ = uVar13;
      auVar35._28_4_ = uVar13;
      auVar34 = vpmulld_avx2(auVar20,auVar35);
      auVar33 = vpaddd_avx2(auVar33,auVar34);
      auVar20 = vpmulld_avx2(auVar20,auVar36);
      auVar19 = vpmulld_avx2(auVar35,auVar19);
      auVar19 = vpsubd_avx2(auVar38,auVar19);
      auVar19 = vpaddd_avx2(auVar19,auVar20);
      auVar14 = vpsrad_avx2(auVar14,auVar56);
      auVar20 = vpsrad_avx2(auVar23,auVar56);
      auVar23 = vpsrad_avx2(auVar24,auVar56);
      auVar24 = vpsrad_avx2(auVar25,auVar56);
      auVar56 = ZEXT416(local_460);
      auVar22 = vpsrad_avx2(auVar22,auVar56);
      auVar15 = vpsrad_avx2(auVar15,auVar56);
      auVar25 = vpsrad_avx2(auVar26,auVar56);
      auVar26 = vpsrad_avx2(auVar28,auVar56);
      auVar28 = vpsrad_avx2(auVar29,auVar56);
      auVar21 = vpsrad_avx2(auVar21,auVar56);
      auVar27 = vpsrad_avx2(auVar27,auVar56);
      auVar29 = vpsrad_avx2(auVar30,auVar56);
      auVar30 = vpsrad_avx2(auVar31,auVar56);
      auVar31 = vpsrad_avx2(auVar32,auVar56);
      auVar32 = vpsrad_avx2(auVar33,auVar56);
      auVar19 = vpsrad_avx2(auVar19,auVar56);
      *(undefined1 (*) [32])((long)*out + lVar55) = auVar14;
      *(undefined1 (*) [32])((long)out[outstride] + lVar55) = auVar28;
      *(undefined1 (*) [32])((long)out[outstride * 2] + lVar55) = auVar22;
      *(undefined1 (*) [32])((long)out[outstride * 3] + lVar55) = auVar19;
      *(undefined1 (*) [32])((long)out[outstride * 4] + lVar55) = auVar23;
      *(undefined1 (*) [32])((long)out[outstride * 5] + lVar55) = auVar30;
      *(undefined1 (*) [32])((long)out[outstride * 6] + lVar55) = auVar26;
      *(undefined1 (*) [32])((long)out[outstride * 7] + lVar55) = auVar29;
      *(undefined1 (*) [32])((long)out[outstride * 8] + lVar55) = auVar20;
      *(undefined1 (*) [32])((long)out[outstride * 9] + lVar55) = auVar27;
      *(undefined1 (*) [32])((long)out[outstride * 10] + lVar55) = auVar25;
      *(undefined1 (*) [32])((long)out[outstride * 0xb] + lVar55) = auVar31;
      local_3f8 = auVar24._0_8_;
      uStack_3f0 = auVar24._8_8_;
      uStack_3e8 = auVar24._16_8_;
      uStack_3e0 = auVar24._24_8_;
      puVar1 = (undefined8 *)((long)out[outstride * 0xc] + lVar55);
      *puVar1 = local_3f8;
      puVar1[1] = uStack_3f0;
      puVar1[2] = uStack_3e8;
      puVar1[3] = uStack_3e0;
      *(undefined1 (*) [32])((long)out[outstride * 0xd] + lVar55) = auVar32;
      *(undefined1 (*) [32])((long)out[outstride * 0xe] + lVar55) = auVar15;
      *(undefined1 (*) [32])((long)out[outstride * 0xf] + lVar55) = auVar21;
      lVar55 = lVar55 + 0x20;
    } while ((ulong)(uint)col_num * 0x20 != lVar55);
  }
  return;
}

Assistant:

static void fdct16_avx2(__m256i *in, __m256i *out, const int8_t bit,
                        const int col_num, const int outstride) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  __m256i u[16], v[16], x;
  int col;

  // Calculate the column 0, 1, 2, 3
  for (col = 0; col < col_num; ++col) {
    // stage 0
    // stage 1
    u[0] = _mm256_add_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[15] = _mm256_sub_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[1] = _mm256_add_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[14] = _mm256_sub_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[2] = _mm256_add_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[13] = _mm256_sub_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[3] = _mm256_add_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[12] = _mm256_sub_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[4] = _mm256_add_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[11] = _mm256_sub_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[5] = _mm256_add_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[10] = _mm256_sub_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[6] = _mm256_add_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[9] = _mm256_sub_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[7] = _mm256_add_epi32(in[7 * col_num + col], in[8 * col_num + col]);
    u[8] = _mm256_sub_epi32(in[7 * col_num + col], in[8 * col_num + col]);

    // stage 2
    v[0] = _mm256_add_epi32(u[0], u[7]);
    v[7] = _mm256_sub_epi32(u[0], u[7]);
    v[1] = _mm256_add_epi32(u[1], u[6]);
    v[6] = _mm256_sub_epi32(u[1], u[6]);
    v[2] = _mm256_add_epi32(u[2], u[5]);
    v[5] = _mm256_sub_epi32(u[2], u[5]);
    v[3] = _mm256_add_epi32(u[3], u[4]);
    v[4] = _mm256_sub_epi32(u[3], u[4]);
    v[8] = u[8];
    v[9] = u[9];

    v[10] = _mm256_mullo_epi32(u[10], cospim32);
    x = _mm256_mullo_epi32(u[13], cospi32);
    v[10] = _mm256_add_epi32(v[10], x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[13] = _mm256_mullo_epi32(u[10], cospi32);
    x = _mm256_mullo_epi32(u[13], cospim32);
    v[13] = _mm256_sub_epi32(v[13], x);
    v[13] = _mm256_add_epi32(v[13], rnding);
    v[13] = _mm256_srai_epi32(v[13], bit);

    v[11] = _mm256_mullo_epi32(u[11], cospim32);
    x = _mm256_mullo_epi32(u[12], cospi32);
    v[11] = _mm256_add_epi32(v[11], x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    v[12] = _mm256_mullo_epi32(u[11], cospi32);
    x = _mm256_mullo_epi32(u[12], cospim32);
    v[12] = _mm256_sub_epi32(v[12], x);
    v[12] = _mm256_add_epi32(v[12], rnding);
    v[12] = _mm256_srai_epi32(v[12], bit);
    v[14] = u[14];
    v[15] = u[15];

    // stage 3
    u[0] = _mm256_add_epi32(v[0], v[3]);
    u[3] = _mm256_sub_epi32(v[0], v[3]);
    u[1] = _mm256_add_epi32(v[1], v[2]);
    u[2] = _mm256_sub_epi32(v[1], v[2]);
    u[4] = v[4];

    u[5] = _mm256_mullo_epi32(v[5], cospim32);
    x = _mm256_mullo_epi32(v[6], cospi32);
    u[5] = _mm256_add_epi32(u[5], x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    u[6] = _mm256_mullo_epi32(v[5], cospi32);
    x = _mm256_mullo_epi32(v[6], cospim32);
    u[6] = _mm256_sub_epi32(u[6], x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    u[7] = v[7];
    u[8] = _mm256_add_epi32(v[8], v[11]);
    u[11] = _mm256_sub_epi32(v[8], v[11]);
    u[9] = _mm256_add_epi32(v[9], v[10]);
    u[10] = _mm256_sub_epi32(v[9], v[10]);
    u[12] = _mm256_sub_epi32(v[15], v[12]);
    u[15] = _mm256_add_epi32(v[15], v[12]);
    u[13] = _mm256_sub_epi32(v[14], v[13]);
    u[14] = _mm256_add_epi32(v[14], v[13]);

    // stage 4
    u[0] = _mm256_mullo_epi32(u[0], cospi32);
    u[1] = _mm256_mullo_epi32(u[1], cospi32);
    v[0] = _mm256_add_epi32(u[0], u[1]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    v[0] = _mm256_srai_epi32(v[0], bit);

    v[1] = _mm256_sub_epi32(u[0], u[1]);
    v[1] = _mm256_add_epi32(v[1], rnding);
    v[1] = _mm256_srai_epi32(v[1], bit);

    v[2] = _mm256_mullo_epi32(u[2], cospi48);
    x = _mm256_mullo_epi32(u[3], cospi16);
    v[2] = _mm256_add_epi32(v[2], x);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_mullo_epi32(u[2], cospi16);
    x = _mm256_mullo_epi32(u[3], cospi48);
    v[3] = _mm256_sub_epi32(x, v[3]);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    v[4] = _mm256_add_epi32(u[4], u[5]);
    v[5] = _mm256_sub_epi32(u[4], u[5]);
    v[6] = _mm256_sub_epi32(u[7], u[6]);
    v[7] = _mm256_add_epi32(u[7], u[6]);
    v[8] = u[8];

    v[9] = _mm256_mullo_epi32(u[9], cospim16);
    x = _mm256_mullo_epi32(u[14], cospi48);
    v[9] = _mm256_add_epi32(v[9], x);
    v[9] = _mm256_add_epi32(v[9], rnding);
    v[9] = _mm256_srai_epi32(v[9], bit);

    v[14] = _mm256_mullo_epi32(u[9], cospi48);
    x = _mm256_mullo_epi32(u[14], cospim16);
    v[14] = _mm256_sub_epi32(v[14], x);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[10] = _mm256_mullo_epi32(u[10], cospim48);
    x = _mm256_mullo_epi32(u[13], cospim16);
    v[10] = _mm256_add_epi32(v[10], x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[13] = _mm256_mullo_epi32(u[10], cospim16);
    x = _mm256_mullo_epi32(u[13], cospim48);
    v[13] = _mm256_sub_epi32(v[13], x);
    v[13] = _mm256_add_epi32(v[13], rnding);
    v[13] = _mm256_srai_epi32(v[13], bit);

    v[11] = u[11];
    v[12] = u[12];
    v[15] = u[15];

    // stage 5
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];

    u[4] = _mm256_mullo_epi32(v[4], cospi56);
    x = _mm256_mullo_epi32(v[7], cospi8);
    u[4] = _mm256_add_epi32(u[4], x);
    u[4] = _mm256_add_epi32(u[4], rnding);
    u[4] = _mm256_srai_epi32(u[4], bit);

    u[7] = _mm256_mullo_epi32(v[4], cospi8);
    x = _mm256_mullo_epi32(v[7], cospi56);
    u[7] = _mm256_sub_epi32(x, u[7]);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    u[5] = _mm256_mullo_epi32(v[5], cospi24);
    x = _mm256_mullo_epi32(v[6], cospi40);
    u[5] = _mm256_add_epi32(u[5], x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    u[6] = _mm256_mullo_epi32(v[5], cospi40);
    x = _mm256_mullo_epi32(v[6], cospi24);
    u[6] = _mm256_sub_epi32(x, u[6]);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    u[8] = _mm256_add_epi32(v[8], v[9]);
    u[9] = _mm256_sub_epi32(v[8], v[9]);
    u[10] = _mm256_sub_epi32(v[11], v[10]);
    u[11] = _mm256_add_epi32(v[11], v[10]);
    u[12] = _mm256_add_epi32(v[12], v[13]);
    u[13] = _mm256_sub_epi32(v[12], v[13]);
    u[14] = _mm256_sub_epi32(v[15], v[14]);
    u[15] = _mm256_add_epi32(v[15], v[14]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = _mm256_mullo_epi32(u[8], cospi60);
    x = _mm256_mullo_epi32(u[15], cospi4);
    v[8] = _mm256_add_epi32(v[8], x);
    v[8] = _mm256_add_epi32(v[8], rnding);
    v[8] = _mm256_srai_epi32(v[8], bit);

    v[15] = _mm256_mullo_epi32(u[8], cospi4);
    x = _mm256_mullo_epi32(u[15], cospi60);
    v[15] = _mm256_sub_epi32(x, v[15]);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    v[9] = _mm256_mullo_epi32(u[9], cospi28);
    x = _mm256_mullo_epi32(u[14], cospi36);
    v[9] = _mm256_add_epi32(v[9], x);
    v[9] = _mm256_add_epi32(v[9], rnding);
    v[9] = _mm256_srai_epi32(v[9], bit);

    v[14] = _mm256_mullo_epi32(u[9], cospi36);
    x = _mm256_mullo_epi32(u[14], cospi28);
    v[14] = _mm256_sub_epi32(x, v[14]);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[10] = _mm256_mullo_epi32(u[10], cospi44);
    x = _mm256_mullo_epi32(u[13], cospi20);
    v[10] = _mm256_add_epi32(v[10], x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[13] = _mm256_mullo_epi32(u[10], cospi20);
    x = _mm256_mullo_epi32(u[13], cospi44);
    v[13] = _mm256_sub_epi32(x, v[13]);
    v[13] = _mm256_add_epi32(v[13], rnding);
    v[13] = _mm256_srai_epi32(v[13], bit);

    v[11] = _mm256_mullo_epi32(u[11], cospi12);
    x = _mm256_mullo_epi32(u[12], cospi52);
    v[11] = _mm256_add_epi32(v[11], x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    v[12] = _mm256_mullo_epi32(u[11], cospi52);
    x = _mm256_mullo_epi32(u[12], cospi12);
    v[12] = _mm256_sub_epi32(x, v[12]);
    v[12] = _mm256_add_epi32(v[12], rnding);
    v[12] = _mm256_srai_epi32(v[12], bit);

    out[0 * outstride + col] = v[0];
    out[1 * outstride + col] = v[8];
    out[2 * outstride + col] = v[4];
    out[3 * outstride + col] = v[12];
    out[4 * outstride + col] = v[2];
    out[5 * outstride + col] = v[10];
    out[6 * outstride + col] = v[6];
    out[7 * outstride + col] = v[14];
    out[8 * outstride + col] = v[1];
    out[9 * outstride + col] = v[9];
    out[10 * outstride + col] = v[5];
    out[11 * outstride + col] = v[13];
    out[12 * outstride + col] = v[3];
    out[13 * outstride + col] = v[11];
    out[14 * outstride + col] = v[7];
    out[15 * outstride + col] = v[15];
  }
}